

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# residual_functions.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
IsobarVLEResiduals<double>::call
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          IsobarVLEResiduals<double> *this,vector<double,_std::allocator<double>_> *rhovec)

{
  PointerArgType dataPtr;
  ulong uVar1;
  Index IVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  CoeffReturnType pdVar6;
  reference pvVar7;
  CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4> *this_00;
  double dVar8;
  double dVar9;
  double dVar10;
  allocator local_131;
  string local_130;
  ulong local_110;
  size_t i;
  double chempotr1V;
  double chempotr0V;
  double pV;
  double chempotr1L;
  double chempotr0L;
  double pL;
  double R;
  MixDerivs<double> *derV;
  MixDerivs<double> *derL;
  undefined1 local_b8 [16];
  Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_a8;
  undefined1 local_90 [8];
  EigenArray rhovecV;
  Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_78;
  undefined1 local_60 [8];
  EigenArray rhovecL;
  size_t N;
  allocator<double> local_31;
  value_type_conflict1 local_30;
  byte local_21;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *rhovec_local;
  IsobarVLEResiduals<double> *this_local;
  vector<double,_std::allocator<double>_> *y;
  
  local_20 = rhovec;
  rhovec_local = (vector<double,_std::allocator<double>_> *)this;
  this_local = (IsobarVLEResiduals<double> *)__return_storage_ptr__;
  sVar4 = std::vector<double,_std::allocator<double>_>::size(rhovec);
  if ((sVar4 & 1) != 0) {
    __assert_fail("rhovec.size() % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/include/isochoric/residual_functions.h"
                  ,0x7a,
                  "virtual std::vector<TYPE> IsobarVLEResiduals<>::call(const std::vector<TYPE> &) [TYPE = double]"
                 );
  }
  local_21 = 0;
  sVar4 = std::vector<double,_std::allocator<double>_>::size(local_20);
  local_30 = INFINITY;
  std::allocator<double>::allocator(&local_31);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,sVar4,&local_30,&local_31);
  std::allocator<double>::~allocator(&local_31);
  sVar4 = std::vector<double,_std::allocator<double>_>::size(local_20);
  rhovecL.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       sVar4 >> 1;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_20,0);
  IVar2 = rhovecL.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::Stride<0,_0>::Stride
            ((Stride<0,_0> *)
             ((long)&rhovecV.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage
                     .m_rows + 6));
  Eigen::Map<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (&local_78,pvVar5,IVar2,
             (Stride<0,_0> *)
             ((long)&rhovecV.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage
                     .m_rows + 6));
  Eigen::Array<double,-1,1,0,-1,1>::
  Array<Eigen::Map<Eigen::Array<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
            ((Array<double,_1,1,0,_1,1> *)local_60,&local_78);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_20,0);
  IVar2 = rhovecL.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  dataPtr = pvVar5 + rhovecL.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage
                     .m_rows;
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)(local_b8 + 0xe));
  Eigen::Map<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (&local_a8,dataPtr,IVar2,(Stride<0,_0> *)(local_b8 + 0xe));
  Eigen::Array<double,-1,1,0,-1,1>::
  Array<Eigen::Map<Eigen::Array<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
            ((Array<double,_1,1,0,_1,1> *)local_90,&local_a8);
  std::
  function<std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>_(double,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_&)>
  ::operator()((function<std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>_(double,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_&)>
                *)local_b8,this->m_T,(Array<double,__1,_1,_0,__1,_1> *)&this->m_factory);
  std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
  operator=(&this->m_derL,
            (unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_> *)
            local_b8);
  std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
  ~unique_ptr((unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_> *
              )local_b8);
  std::
  function<std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>_(double,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_&)>
  ::operator()((function<std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>_(double,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_&)>
                *)&derL,this->m_T,(Array<double,__1,_1,_0,__1,_1> *)&this->m_factory);
  std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
  operator=(&this->m_derV,
            (unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_> *)
            &derL);
  std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
  ~unique_ptr((unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_> *
              )&derL);
  derV = std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
         operator*(&this->m_derL);
  R = (double)std::
              unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
              operator*(&this->m_derV);
  pL = derV->R;
  chempotr0L = MixDerivs<double>::p(derV);
  chempotr1L = MixDerivs<double>::dpsir_drhoi__constTrhoj(derV,0);
  pV = MixDerivs<double>::dpsir_drhoi__constTrhoj(derV,1);
  chempotr0V = MixDerivs<double>::p((MixDerivs<double> *)R);
  chempotr1V = MixDerivs<double>::dpsir_drhoi__constTrhoj((MixDerivs<double> *)R,0);
  i = (size_t)MixDerivs<double>::dpsir_drhoi__constTrhoj((MixDerivs<double> *)R,1);
  dVar8 = chempotr1L - chempotr1V;
  dVar9 = pL * this->m_T;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)local_60,0);
  dVar10 = *pdVar6;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)local_90,0);
  dVar10 = log(dVar10 / *pdVar6);
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,0);
  *pvVar7 = dVar9 * dVar10 + dVar8;
  dVar8 = pV - (double)i;
  dVar9 = pL * this->m_T;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)local_60,1);
  dVar10 = *pdVar6;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)local_90,1);
  dVar10 = log(dVar10 / *pdVar6);
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,1);
  *pvVar7 = dVar9 * dVar10 + dVar8;
  dVar10 = chempotr0L - this->m_p;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,2);
  *pvVar7 = dVar10;
  dVar10 = chempotr0V - this->m_p;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,3);
  *pvVar7 = dVar10;
  local_110 = 0;
  while( true ) {
    uVar1 = local_110;
    sVar4 = std::vector<double,_std::allocator<double>_>::size(__return_storage_ptr__);
    if (sVar4 <= uVar1) {
      local_21 = 1;
      Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array((Array<double,__1,_1,_0,__1,_1> *)local_90);
      Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array((Array<double,__1,_1,_0,__1,_1> *)local_60);
      if ((local_21 & 1) == 0) {
        std::vector<double,_std::allocator<double>_>::~vector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (__return_storage_ptr__,local_110);
    bVar3 = ValidNumber(*pvVar7);
    if (!bVar3) break;
    local_110 = local_110 + 1;
  }
  this_00 = (CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4> *)__cxa_allocate_exception(0x30)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"Invalid value found",&local_131);
  CoolProp::CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::CoolPropError
            (this_00,&local_130,eValue);
  __cxa_throw(this_00,&CoolProp::CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::typeinfo,
              CoolProp::CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::~CoolPropError);
}

Assistant:

std::vector<TYPE> call(const std::vector<TYPE> &rhovec) {
        assert(rhovec.size() % 2 == 0); // Even length
        std::vector<TYPE> y(rhovec.size(), _HUGE);
        std::size_t N = rhovec.size() / 2;
        const EigenArray rhovecL = Eigen::Map<const EigenArray>(&(rhovec[0]), N);
        const EigenArray rhovecV = Eigen::Map<const EigenArray>(&(rhovec[0]) + N, N);

        m_derL = m_factory(m_T, rhovecL);
        m_derV = m_factory(m_T, rhovecV);
        auto &derL = *m_derL, &derV = *m_derV;
        TYPE R = derL.R;

        TYPE pL = derL.p(), chempotr0L = derL.dpsir_drhoi__constTrhoj(0), chempotr1L = derL.dpsir_drhoi__constTrhoj(1);
        TYPE pV = derV.p(), chempotr0V = derV.dpsir_drhoi__constTrhoj(0), chempotr1V = derV.dpsir_drhoi__constTrhoj(1);

        y[0] = chempotr0L - chempotr0V + R*m_T*log(rhovecL[0]/rhovecV[0]);
        y[1] = chempotr1L - chempotr1V + R*m_T*log(rhovecL[1]/rhovecV[1]);
        y[2] = pL - m_p;
        y[3] = pV - m_p;
        for (std::size_t i = 0; i < y.size(); ++i) {
            if (!ValidNumber(y[i])) {
                throw ValueError("Invalid value found");
            }
        }
        return y;
    }